

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O0

DdNode * Llb_NonlinComputeInitState(Aig_Man_t *pAig,DdManager *dd)

{
  abctime aVar1;
  Vec_Ptr_t *p;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pObj_00;
  DdNode *pDVar4;
  int local_64;
  abctime TimeStop;
  int iVar;
  int i;
  DdNode *bTemp;
  DdNode *bVar;
  DdNode *bRes;
  Aig_Obj_t *pObj;
  DdManager *dd_local;
  Aig_Man_t *pAig_local;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  bVar = Cudd_ReadOne(dd);
  Cudd_Ref(bVar);
  for (TimeStop._4_4_ = 0; iVar2 = Saig_ManRegNum(pAig), TimeStop._4_4_ < iVar2;
      TimeStop._4_4_ = TimeStop._4_4_ + 1) {
    p = pAig->vCis;
    iVar2 = Saig_ManPiNum(pAig);
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p,TimeStop._4_4_ + iVar2);
    iVar2 = Cudd_ReadSize(dd);
    iVar3 = Aig_ManRegNum(pAig);
    if (iVar2 == iVar3) {
      local_64 = TimeStop._4_4_;
    }
    else {
      local_64 = Aig_ObjId(pObj_00);
    }
    pDVar4 = Cudd_bddIthVar(dd,local_64);
    pDVar4 = Cudd_bddAnd(dd,bVar,(DdNode *)((ulong)pDVar4 ^ 1));
    Cudd_Ref(pDVar4);
    Cudd_RecursiveDeref(dd,bVar);
    bVar = pDVar4;
  }
  Cudd_Deref(bVar);
  dd->TimeStop = aVar1;
  return bVar;
}

Assistant:

DdNode * Llb_NonlinComputeInitState( Aig_Man_t * pAig, DdManager * dd )
{
    Aig_Obj_t * pObj;
    DdNode * bRes, * bVar, * bTemp;
    int i, iVar;
    abctime TimeStop;
    TimeStop = dd->TimeStop;  dd->TimeStop = 0;
    bRes = Cudd_ReadOne( dd );   Cudd_Ref( bRes );
    Saig_ManForEachLo( pAig, pObj, i )
    {
        iVar = (Cudd_ReadSize(dd) == Aig_ManRegNum(pAig)) ? i : Aig_ObjId(pObj);
        bVar = Cudd_bddIthVar( dd, iVar );
        bRes = Cudd_bddAnd( dd, bTemp = bRes, Cudd_Not(bVar) );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    dd->TimeStop = TimeStop;
    return bRes;
}